

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQInteger __thiscall SQSharedState::CollectGarbage(SQSharedState *this,SQVM *vm)

{
  SQUnsignedInteger *pSVar1;
  SQCollectable_conflict *pSVar2;
  SQInteger SVar3;
  SQCollectable_conflict *pSVar4;
  SQCollectable *this_00;
  SQCollectable_conflict *tchain;
  SQCollectable_conflict *local_28;
  
  local_28 = (SQCollectable_conflict *)0x0;
  RunMark(this,vm,&local_28);
  pSVar4 = this->_gc_chain;
  if (pSVar4 == (SQCollectable_conflict *)0x0) {
    SVar3 = 0;
    this_00 = (SQCollectable *)local_28;
  }
  else {
    pSVar1 = &(pSVar4->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SVar3 = 0;
    do {
      (*(pSVar4->super_SQRefCounted)._vptr_SQRefCounted[5])(pSVar4);
      pSVar2 = pSVar4->_next;
      if (pSVar2 != (SQCollectable_conflict *)0x0) {
        pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pSVar1 = &(pSVar4->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQRefCounted)._vptr_SQRefCounted[2])(pSVar4);
      }
      SVar3 = SVar3 + 1;
      pSVar4 = pSVar2;
      this_00 = (SQCollectable *)local_28;
    } while (pSVar2 != (SQCollectable_conflict *)0x0);
  }
  for (; this_00 != (SQCollectable *)0x0; this_00 = this_00->_next) {
    SQCollectable::UnMark(this_00);
  }
  this->_gc_chain = local_28;
  return SVar3;
}

Assistant:

SQInteger SQSharedState::CollectGarbage(SQVM *vm)
{
    SQInteger n = 0;
    SQCollectable *tchain = NULL;

    RunMark(vm,&tchain);

    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
            n++;
        }
    }

    t = tchain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }
    _gc_chain = tchain;

    return n;
}